

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

void read_config_file(fnchar *filename)

{
  byte *pbVar1;
  byte bVar2;
  FILE *__stream;
  long lVar3;
  char *__s;
  char *pcVar4;
  char *pcVar5;
  ushort **ppuVar6;
  byte *pbVar7;
  byte *pbVar8;
  ushort *puVar9;
  size_t __size;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  fseek(__stream,0,2);
  lVar3 = ftell(__stream);
  rewind(__stream);
  if ((int)lVar3 != 0) {
    __s = (char *)malloc((lVar3 << 0x20) + 0x100000000 >> 0x20);
    if (__s != (char *)0x0) {
      __size = (lVar3 << 0x20) >> 0x20;
      fread(__s,__size,1,__stream);
      fclose(__stream);
      __s[__size] = '\0';
      pcVar4 = strtok(__s,"\n");
      do {
        pcVar5 = strchr(pcVar4,0x23);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
        pcVar5 = strchr(pcVar4,0x3d);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
          ppuVar6 = __ctype_b_loc();
          puVar9 = *ppuVar6;
          pcVar4 = pcVar4 + -1;
          do {
            pbVar7 = (byte *)(pcVar4 + 1);
            pcVar4 = pcVar4 + 1;
          } while ((*(byte *)((long)puVar9 + (ulong)*pbVar7 * 2 + 1) & 0x20) != 0);
          pbVar7 = (byte *)(pcVar5 + -1);
          bVar2 = *(byte *)((long)puVar9 + (ulong)(byte)pcVar5[-1] * 2 + 1);
          pbVar8 = pbVar7;
          while ((bVar2 & 0x20) != 0) {
            *pbVar8 = 0;
            puVar9 = *ppuVar6;
            pbVar1 = pbVar8 + -1;
            pbVar8 = pbVar8 + -1;
            bVar2 = *(byte *)((long)puVar9 + (ulong)*pbVar1 * 2 + 1);
          }
          do {
            pbVar8 = pbVar7 + 2;
            pbVar7 = pbVar7 + 1;
            pbVar1 = (byte *)(pcVar5 + 1);
          } while (*pbVar8 != 0);
          do {
            pbVar8 = pbVar1;
            pbVar1 = pbVar8 + 1;
          } while ((*(byte *)((long)puVar9 + (ulong)*pbVar8 * 2 + 1) & 0x20) != 0);
          bVar2 = *pbVar7;
          puVar9 = *ppuVar6;
          while ((*(byte *)((long)puVar9 + (ulong)bVar2 * 2 + 1) & 0x20) != 0) {
            *pbVar7 = 0;
            bVar2 = pbVar7[-1];
            pbVar7 = pbVar7 + -1;
            puVar9 = *ppuVar6;
          }
          if ((bVar2 == 0x22) && (*pbVar8 == 0x22)) {
            *pbVar7 = 0;
            pbVar8 = pbVar8 + 1;
          }
          nh_set_option(pcVar4,pbVar8,1);
        }
        pcVar4 = strtok((char *)0x0,"\n");
      } while (pcVar4 != (char *)0x0);
      free(__s);
      return;
    }
  }
  fclose(__stream);
  return;
}

Assistant:

static void read_config_file(const fnchar *filename)
{
    FILE *fp;
    int fsize;
    char *buf, *line;
    
    fp = fopen(filename, "rb");
    if (!fp)
	return;

    /* obtain file size. */
    fseek(fp , 0 , SEEK_END);
    fsize = ftell(fp);
    rewind(fp);
    
    if (!fsize) {/* truncated config file */
	fclose(fp);
	return;
    }

    buf = malloc(fsize+1);
    if (!buf) {
	fclose(fp);
	return;
    }

    fread(buf, fsize, 1, fp);
    fclose(fp);
    
    buf[fsize] = '\0';
    
    /* each option is expected to have the following format:
	* name=value\n
	*/
    line = strtok(buf, "\n");
    do {
	read_config_line(line);
	
	line = strtok(NULL, "\n");
    } while (line);
    
    free(buf);
}